

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDeriveFromBdd(void *dd0,void *bFunc,char *pNamePo,Vec_Ptr_t *vNamesPi)

{
  DdManager *dd_00;
  uint uVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  int local_7c;
  int i;
  char *pName;
  DdNode *bTemp;
  DdNode *bSupp;
  Abc_Obj_t *pNodePo;
  Abc_Obj_t *pNodePi;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNamesPiFake;
  Abc_Ntk_t *pNtk;
  DdManager *dd;
  Vec_Ptr_t *vNamesPi_local;
  char *pNamePo_local;
  void *bFunc_local;
  void *dd0_local;
  
  pNode = (Abc_Obj_t *)0x0;
  vNamesPi_local = (Vec_Ptr_t *)pNamePo;
  if (pNamePo == (char *)0x0) {
    vNamesPi_local = (Vec_Ptr_t *)0xcf9cfe;
  }
  dd = (DdManager *)vNamesPi;
  if (vNamesPi == (Vec_Ptr_t *)0x0) {
    pNode = (Abc_Obj_t *)Abc_NodeGetFakeNames(*(int *)((long)dd0 + 0x88));
    dd = (DdManager *)pNode;
  }
  pDVar3 = Cudd_Support((DdManager *)dd0,(DdNode *)bFunc);
  Cudd_Ref(pDVar3);
  for (pName = (char *)pDVar3; pDVar4 = Cudd_ReadOne((DdManager *)dd0), (DdNode *)pName != pDVar4;
      pName = *(char **)(pName + 0x10)) {
    uVar1 = Cudd_NodeReadIndex((DdNode *)pName);
    iVar2 = Vec_PtrSize((Vec_Ptr_t *)dd);
    if (iVar2 <= (int)uVar1) break;
  }
  Cudd_RecursiveDeref((DdManager *)dd0,pDVar3);
  pDVar3 = Cudd_ReadOne((DdManager *)dd0);
  if ((DdNode *)pName == pDVar3) {
    dd0_local = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
    pcVar5 = Extra_UtilStrsav((char *)vNamesPi_local);
    ((Abc_Ntk_t *)dd0_local)->pName = pcVar5;
    dd_00 = (DdManager *)((Abc_Ntk_t *)dd0_local)->pManFunc;
    iVar2 = Vec_PtrSize((Vec_Ptr_t *)dd);
    Cudd_bddIthVar(dd_00,iVar2);
    for (local_7c = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)dd), local_7c < iVar2;
        local_7c = local_7c + 1) {
      pcVar5 = (char *)Vec_PtrEntry((Vec_Ptr_t *)dd,local_7c);
      pAVar6 = Abc_NtkCreatePi((Abc_Ntk_t *)dd0_local);
      Abc_ObjAssignName(pAVar6,pcVar5,(char *)0x0);
    }
    pAVar6 = Abc_NtkCreateNode((Abc_Ntk_t *)dd0_local);
    pDVar3 = Cudd_bddTransfer((DdManager *)dd0,(DdManager *)((Abc_Ntk_t *)dd0_local)->pManFunc,
                              (DdNode *)bFunc);
    (pAVar6->field_5).pData = pDVar3;
    Cudd_Ref((DdNode *)(pAVar6->field_5).pData);
    for (local_7c = 0; iVar2 = Abc_NtkPiNum((Abc_Ntk_t *)dd0_local), local_7c < iVar2;
        local_7c = local_7c + 1) {
      pAVar7 = Abc_NtkPi((Abc_Ntk_t *)dd0_local,local_7c);
      Abc_ObjAddFanin(pAVar6,pAVar7);
    }
    pAVar7 = Abc_NtkCreatePo((Abc_Ntk_t *)dd0_local);
    Abc_ObjAddFanin(pAVar7,pAVar6);
    Abc_ObjAssignName(pAVar7,(char *)vNamesPi_local,(char *)0x0);
    Abc_NtkMinimumBase((Abc_Ntk_t *)dd0_local);
    if (pNode != (Abc_Obj_t *)0x0) {
      Abc_NodeFreeNames((Vec_Ptr_t *)pNode);
    }
    iVar2 = Abc_NtkCheck((Abc_Ntk_t *)dd0_local);
    if (iVar2 == 0) {
      fprintf(_stdout,"Abc_NtkDeriveFromBdd(): Network check has failed.\n");
    }
  }
  else {
    dd0_local = (void *)0x0;
  }
  return (Abc_Ntk_t *)dd0_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDeriveFromBdd( void * dd0, void * bFunc, char * pNamePo, Vec_Ptr_t * vNamesPi )
{
    DdManager * dd = (DdManager *)dd0;
    Abc_Ntk_t * pNtk; 
    Vec_Ptr_t * vNamesPiFake = NULL;
    Abc_Obj_t * pNode, * pNodePi, * pNodePo;
    DdNode * bSupp, * bTemp;
    char * pName;
    int i;

    // supply fake names if real names are not given
    if ( pNamePo == NULL )
        pNamePo = "F";
    if ( vNamesPi == NULL )
    {
        vNamesPiFake = Abc_NodeGetFakeNames( dd->size );
        vNamesPi = vNamesPiFake;
    }

    // make sure BDD depends on the variables whose index 
    // does not exceed the size of the array with PI names
    bSupp = Cudd_Support( dd, (DdNode *)bFunc );   Cudd_Ref( bSupp );
    for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
        if ( (int)Cudd_NodeReadIndex(bTemp) >= Vec_PtrSize(vNamesPi) )
            break;
    Cudd_RecursiveDeref( dd, bSupp );
    if ( bTemp != Cudd_ReadOne(dd) )
        return NULL;

    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    pNtk->pName = Extra_UtilStrsav(pNamePo);
    // make sure the new manager has enough inputs
    Cudd_bddIthVar( (DdManager *)pNtk->pManFunc, Vec_PtrSize(vNamesPi) );
    // add the PIs corresponding to the names
    Vec_PtrForEachEntry( char *, vNamesPi, pName, i )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtk), pName, NULL );
    // create the node
    pNode = Abc_NtkCreateNode( pNtk );
    pNode->pData = (DdNode *)Cudd_bddTransfer( dd, (DdManager *)pNtk->pManFunc, (DdNode *)bFunc ); Cudd_Ref((DdNode *)pNode->pData);
    Abc_NtkForEachPi( pNtk, pNodePi, i )
        Abc_ObjAddFanin( pNode, pNodePi );
    // create the only PO
    pNodePo = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pNodePo, pNode );
    Abc_ObjAssignName( pNodePo, pNamePo, NULL );
    // make the network minimum base
    Abc_NtkMinimumBase( pNtk );
    if ( vNamesPiFake )
        Abc_NodeFreeNames( vNamesPiFake );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkDeriveFromBdd(): Network check has failed.\n" );
    return pNtk;
}